

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_blob_detection.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  BlobParameters parameter;
  bool bVar1;
  uint8_t uVar2;
  undefined8 uVar3;
  BlobDetection *this;
  BlobInfo *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar4;
  size_type sVar5;
  ostream *this_01;
  long in_RSI;
  int in_EDI;
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  exception *ex;
  size_t i;
  BlobInfo *blob;
  string *in_stack_00000188;
  BlobDetection detection;
  uint8_t thresholdValue;
  vector<unsigned_int,_std::allocator<unsigned_int>_> histogram;
  Image image;
  string filePath;
  undefined1 auVar9 [24];
  BlobParameters *this_02;
  string *path;
  undefined1 in_stack_fffffffffffffcc8 [64];
  undefined8 in_stack_fffffffffffffdb0;
  BlobCriterion criterion;
  allocator local_209;
  string local_208 [31];
  uint8_t in_stack_fffffffffffffe17;
  Image *in_stack_fffffffffffffe18;
  ulong uVar10;
  ulong __n;
  BlobDetection *in_stack_fffffffffffffe20;
  undefined8 local_1d8;
  undefined1 auVar11 [56];
  undefined1 auVar12 [16];
  undefined1 auVar14 [32];
  undefined1 auVar13 [48];
  undefined1 auVar15 [16];
  undefined8 in_stack_fffffffffffffeb8;
  BlobDetection local_140 [2];
  uint8_t local_f9;
  undefined1 local_b2;
  allocator local_b1;
  string local_b0 [64];
  ImageTemplate<unsigned_char> local_70;
  allocator local_31;
  string local_30 [32];
  long local_10;
  int local_8;
  int local_4;
  
  criterion = (BlobCriterion)((ulong)in_stack_fffffffffffffdb0 >> 0x20);
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"mercury.bmp",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  if (1 < local_8) {
    std::__cxx11::string::operator=(local_30,*(char **)(local_10 + 8));
  }
  Bitmap_Operation::Load(in_stack_00000188);
  bVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::empty(&local_70);
  auVar9 = in_stack_fffffffffffffcc8._0_24_;
  auVar11 = in_stack_fffffffffffffcc8._48_56_;
  if (bVar1) {
    local_b2 = 1;
    uVar3 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"Cannot load ",&local_b1);
    auVar12 = auVar11._40_16_;
    std::operator+(auVar11._8_8_,auVar11._0_8_);
    imageException::imageException(auVar12._8_8_,auVar12._0_8_);
    local_b2 = 0;
    __cxa_throw(uVar3,&imageException::typeinfo,imageException::~imageException);
  }
  uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::colorCount(&local_70);
  if (uVar2 != '\x01') {
    Image_Function::ConvertToGrayScale(auVar9._0_8_);
    PenguinV_Image::ImageTemplate<unsigned_char>::operator=(auVar9._8_8_,auVar9._0_8_);
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
              ((ImageTemplate<unsigned_char> *)0x103896);
  }
  Image_Function::Histogram(auVar9._0_8_);
  local_f9 = Image_Function::GetThreshold
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1038e2);
  auVar12 = auVar9._0_16_;
  Image_Function::Threshold(auVar9._16_8_,auVar9[0xf]);
  this_02 = auVar12._8_8_;
  PenguinV_Image::ImageTemplate<unsigned_char>::operator=
            ((ImageTemplate<unsigned_char> *)this_02,auVar12._0_8_);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x10393c);
  Blob_Detection::BlobDetection::BlobDetection((BlobDetection *)0x103949);
  auVar8 = ZEXT1664((undefined1  [16])0x0);
  auVar6 = vmovdqu64_avx512f(auVar8);
  auVar15 = auVar6._48_16_;
  auVar6 = vmovdqu64_avx512f(auVar8);
  auVar12 = auVar6._0_16_;
  auVar13 = auVar6._16_48_;
  auVar6 = vmovdqu64_avx512f(auVar8);
  local_1d8 = auVar6._0_8_;
  auVar11 = auVar6._8_56_;
  Blob_Detection::BlobParameters::BlobParameters(this_02);
  auVar6._8_56_ = auVar11;
  auVar6._0_8_ = local_1d8;
  auVar6 = vmovdqu64_avx512f(auVar6);
  auVar8._16_48_ = auVar13;
  auVar8._0_16_ = auVar12;
  auVar8 = vmovdqu64_avx512f(auVar8);
  auVar7._48_16_ = auVar15;
  auVar7._0_48_ = auVar13;
  auVar7 = vmovdqu64_avx512f(auVar7);
  vmovdqu64_avx512f(auVar7);
  vmovdqu64_avx512f(auVar8);
  auVar6 = vmovdqu64_avx512f(auVar6);
  parameter.elongation.checkMaximum = (bool)auVar12[0];
  parameter.elongation._25_7_ = auVar12._1_7_;
  parameter.height.minimum = auVar12._8_4_;
  parameter.height.checkMinimum = (bool)auVar12[0xc];
  parameter.height._5_3_ = auVar12._13_3_;
  auVar14 = auVar11._0_32_;
  parameter.circularity.minimum = (double)auVar14._0_8_;
  parameter.circularity.checkMinimum = (bool)auVar14[8];
  parameter.circularity._9_7_ = auVar14._9_7_;
  parameter.circularity.maximum = (double)auVar14._16_8_;
  parameter.circularity.checkMaximum = (bool)auVar14[0x18];
  parameter.circularity._25_7_ = auVar14._25_7_;
  parameter.elongation.minimum = (double)auVar11._32_8_;
  parameter.elongation.checkMinimum = (bool)auVar11[0x28];
  parameter.elongation._9_7_ = auVar11._41_7_;
  parameter.elongation.maximum = (double)auVar11._48_8_;
  auVar14 = auVar13._8_32_;
  parameter.height.maximum = auVar13._0_4_;
  parameter.height.checkMaximum = (bool)auVar13[4];
  parameter.height._13_3_ = auVar13._5_3_;
  parameter.length.minimum = (double)auVar14._0_8_;
  parameter.length.checkMinimum = (bool)auVar14[8];
  parameter.length._9_7_ = auVar14._9_7_;
  parameter.length.maximum = (double)auVar14._16_8_;
  parameter.length.checkMaximum = (bool)auVar14[0x18];
  parameter.length._25_7_ = auVar14._25_7_;
  parameter.size.minimum = auVar13._40_4_;
  parameter.size.checkMinimum = (bool)auVar13[0x2c];
  parameter.size._5_3_ = auVar13._45_3_;
  parameter.size.maximum = auVar15._0_4_;
  parameter.size.checkMaximum = (bool)auVar15[4];
  parameter.size._13_3_ = auVar15._5_3_;
  parameter.width.minimum = auVar15._8_4_;
  parameter.width.checkMinimum = (bool)auVar15[0xc];
  parameter.width._5_3_ = auVar15._13_3_;
  parameter.width.maximum = (int)in_stack_fffffffffffffeb8;
  parameter.width.checkMaximum = (bool)(char)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  parameter.width._13_3_ = (int3)((ulong)in_stack_fffffffffffffeb8 >> 0x28);
  Blob_Detection::BlobDetection::find
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,parameter,in_stack_fffffffffffffe17
            );
  this = (BlobDetection *)Blob_Detection::BlobDetection::operator()(local_140);
  bVar1 = std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::empty
                    (auVar6._24_8_);
  auVar12 = auVar6._16_16_;
  if (!bVar1) {
    this_00 = Blob_Detection::BlobDetection::getBestBlob(this,criterion);
    PenguinV_Image::ImageTemplate<unsigned_char>::fill(auVar6._40_8_,auVar6[0x27]);
    uVar10 = 0;
    while( true ) {
      __n = uVar10;
      pvVar4 = Blob_Detection::BlobInfo::contourX(this_00);
      sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar4);
      auVar12 = auVar6._16_16_;
      if (sVar5 <= uVar10) break;
      pvVar4 = Blob_Detection::BlobInfo::contourX(this_00);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar4,__n);
      pvVar4 = Blob_Detection::BlobInfo::contourY(this_00);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar4,__n);
      Image_Function::SetPixel(auVar6._56_8_,auVar6._52_4_,auVar6._48_4_,auVar6[0x2f]);
      uVar10 = __n + 1;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_208,"result.bmp",&local_209);
  path = auVar12._8_8_;
  Bitmap_Operation::Save(path,auVar12._0_8_);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  Blob_Detection::BlobDetection::~BlobDetection((BlobDetection *)0x103bfb);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)path);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x103c15);
  this_01 = std::operator<<((ostream *)&std::cout,"Application ended correctly.");
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  local_4 = 0;
  std::__cxx11::string::~string(local_30);
  return local_4;
}

Assistant:

int main( int argc, char * argv[] )
{
    std::string filePath = "mercury.bmp"; // default image path
    if ( argc > 1 ) // Check input data
        filePath = argv[1];

    try // <---- do not forget to put your code into try.. catch block!
    {
        // Load image from storage
        PenguinV_Image::Image image = Bitmap_Operation::Load( filePath );

        // If the image is empty it means that the image doesn't exist or the file is not readable
        if ( image.empty() )
            throw imageException( std::string("Cannot load ") + filePath );

        // Convert to gray-scale image if it's not
        if ( image.colorCount() != PenguinV_Image::GRAY_SCALE )
            image = Image_Function::ConvertToGrayScale( image );

        // Threshold image with calculated optimal threshold
        const std::vector< uint32_t > histogram = Image_Function::Histogram( image );
        const uint8_t thresholdValue = Image_Function::GetThreshold( histogram );
        image = Image_Function::Threshold( image, thresholdValue );

        // Search all possible blobs on image
        Blob_Detection::BlobDetection detection;
        detection.find( image );

        if ( !detection().empty() ) {
            // okay, our image contains some blobs
            // extract a biggest one
            const Blob_Detection::BlobInfo & blob = detection.getBestBlob( Blob_Detection::BlobDetection::CRITERION_SIZE );

            // clear image and draw contour of found blob
            image.fill( 0 );

            for ( size_t i = 0; i < blob.contourX().size(); ++i )
                Image_Function::SetPixel( image, blob.contourX()[i], blob.contourY()[i], 255u );
        }

        // Save result into file
        Bitmap_Operation::Save( "result.bmp", image );
    }
    catch ( const std::exception & ex ) { // uh-oh, something went wrong!
        std::cout << ex.what() << ". Press any button to continue." << std::endl;
        std::cin.ignore();
        return 1;
    }
    catch ( ... ) { // uh-oh, something terrible happen!
        std::cout << "Generic exception raised. Press any button to continue." << std::endl;
        std::cin.ignore();
        return 2;
    }

    std::cout << "Application ended correctly." << std::endl;
    return 0;
}